

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

bool __thiscall
ServerService::sendSegments
          (ServerService *this,byte *data,int socketFD,sockaddr_storage clientDetails,
          int recvWindowSize)

{
  double dVar1;
  undefined1 auVar2 [16];
  double end;
  sockaddr_storage clientDetails_00;
  int iVar3;
  byte4 seqNo_00;
  SendUnit *this_00;
  Congestion *this_01;
  double *pdVar4;
  ostream *poVar5;
  Sliding *this_02;
  ServerSegment *rudp;
  size_type sVar6;
  int *piVar7;
  char *pcVar8;
  reference ppSVar9;
  bool bVar10;
  int local_31c;
  int i;
  fd_set *__arr_1;
  Sliding *pSStack_200;
  uint __i_1;
  sockaddr_storage local_1f8;
  double local_170;
  int local_168;
  int local_164;
  int left;
  int SlideWindowDataNum;
  int sendDataNum;
  int readyDescriptors;
  deque<Sliding_*,_std::allocator<Sliding_*>_> window;
  timeval timeValue;
  byte4 ackNo;
  int nextFD;
  fd_set *__arr;
  undefined1 local_e0 [4];
  uint __i;
  fd_set readFDs;
  int packetNumber;
  int packetDropped;
  Congestion *congestion;
  SendUnit *sendUnit;
  byte *buffer;
  byte4 local_28;
  byte4 sendBase;
  byte4 seqNo;
  byte4 initSeqNo;
  int recvWindowSize_local;
  int socketFD_local;
  byte *data_local;
  ServerService *this_local;
  
  clientDetails_00 = clientDetails;
  iVar3 = rand();
  seqNo_00 = iVar3 % 100;
  sendUnit = (SendUnit *)calloc(0x5c0,1);
  memset(sendUnit,0,0x5c0);
  this_00 = (SendUnit *)operator_new(0x20);
  SendUnit::SendUnit(this_00,seqNo_00,data);
  this_01 = (Congestion *)operator_new(0x38);
  Congestion::Congestion(this_01,recvWindowSize);
  readFDs.fds_bits[0xf]._4_4_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this_00->dataSize;
  readFDs.fds_bits[0xf]._0_4_ = SUB164(auVar2 / ZEXT816(0x5b0),0) + 1;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    readFDs.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  readFDs.fds_bits[(long)(socketFD / 0x40) + -1] =
       1L << ((byte)((long)socketFD % 0x40) & 0x3f) | readFDs.fds_bits[(long)(socketFD / 0x40) + -1]
  ;
  window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  timeValue.tv_sec = 50000;
  std::deque<Sliding_*,_std::allocator<Sliding_*>_>::deque
            ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
  std::deque<Sliding_*,_std::allocator<Sliding_*>_>::clear
            ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
  buffer._4_4_ = seqNo_00;
  local_28 = seqNo_00;
  do {
    local_164 = 0;
    local_168 = 0;
    local_170 = (double)recvWindowSize;
    pdVar4 = std::min<double>((double *)this_01,&local_170);
    left = (int)*pdVar4;
    if ((this_01->isSlowStart & 1U) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Sending Packets in mode: Congestion Avoidance"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"Maximum Packets that will be sent:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,left);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Sending Packets in mode: Slow Start");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"Maximum Packets that will be sent:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,left);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"RetransmissionTime-Out: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this_01->RTO);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::deque<Sliding_*,_std::allocator<Sliding_*>_>::clear
              ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
    while( true ) {
      bVar10 = false;
      if (left != 0) {
        bVar10 = (ulong)(local_28 - seqNo_00) < this_00->dataSize;
      }
      if (!bVar10) break;
      sendUnit = (SendUnit *)SendUnit::getSendUnit(this_00,local_28);
      clientDetails.__ss_padding._110_8_ = clientDetails_00.__ss_padding._110_8_;
      local_1f8.__ss_padding[0x6e] = clientDetails.__ss_padding[0x6e];
      local_1f8.__ss_padding[0x6f] = clientDetails.__ss_padding[0x6f];
      local_1f8.__ss_padding[0x70] = clientDetails.__ss_padding[0x70];
      local_1f8.__ss_padding[0x71] = clientDetails.__ss_padding[0x71];
      local_1f8.__ss_padding[0x72] = clientDetails.__ss_padding[0x72];
      local_1f8.__ss_padding[0x73] = clientDetails.__ss_padding[0x73];
      local_1f8.__ss_padding[0x74] = clientDetails.__ss_padding[0x74];
      local_1f8.__ss_padding[0x75] = clientDetails.__ss_padding[0x75];
      clientDetails.__ss_align = clientDetails_00.__ss_align;
      local_1f8.__ss_align = clientDetails.__ss_align;
      clientDetails.__ss_padding._94_8_ = clientDetails_00.__ss_padding._94_8_;
      local_1f8.__ss_padding[0x5e] = clientDetails.__ss_padding[0x5e];
      local_1f8.__ss_padding[0x5f] = clientDetails.__ss_padding[0x5f];
      local_1f8.__ss_padding[0x60] = clientDetails.__ss_padding[0x60];
      local_1f8.__ss_padding[0x61] = clientDetails.__ss_padding[0x61];
      local_1f8.__ss_padding[0x62] = clientDetails.__ss_padding[0x62];
      local_1f8.__ss_padding[99] = clientDetails.__ss_padding[99];
      local_1f8.__ss_padding[100] = clientDetails.__ss_padding[100];
      local_1f8.__ss_padding[0x65] = clientDetails.__ss_padding[0x65];
      clientDetails.__ss_padding._102_8_ = clientDetails_00.__ss_padding._102_8_;
      local_1f8.__ss_padding[0x66] = clientDetails.__ss_padding[0x66];
      local_1f8.__ss_padding[0x67] = clientDetails.__ss_padding[0x67];
      local_1f8.__ss_padding[0x68] = clientDetails.__ss_padding[0x68];
      local_1f8.__ss_padding[0x69] = clientDetails.__ss_padding[0x69];
      local_1f8.__ss_padding[0x6a] = clientDetails.__ss_padding[0x6a];
      local_1f8.__ss_padding[0x6b] = clientDetails.__ss_padding[0x6b];
      local_1f8.__ss_padding[0x6c] = clientDetails.__ss_padding[0x6c];
      local_1f8.__ss_padding[0x6d] = clientDetails.__ss_padding[0x6d];
      clientDetails.__ss_padding._78_8_ = clientDetails_00.__ss_padding._78_8_;
      local_1f8.__ss_padding[0x4e] = clientDetails.__ss_padding[0x4e];
      local_1f8.__ss_padding[0x4f] = clientDetails.__ss_padding[0x4f];
      local_1f8.__ss_padding[0x50] = clientDetails.__ss_padding[0x50];
      local_1f8.__ss_padding[0x51] = clientDetails.__ss_padding[0x51];
      local_1f8.__ss_padding[0x52] = clientDetails.__ss_padding[0x52];
      local_1f8.__ss_padding[0x53] = clientDetails.__ss_padding[0x53];
      local_1f8.__ss_padding[0x54] = clientDetails.__ss_padding[0x54];
      local_1f8.__ss_padding[0x55] = clientDetails.__ss_padding[0x55];
      clientDetails.__ss_padding._86_8_ = clientDetails_00.__ss_padding._86_8_;
      local_1f8.__ss_padding[0x56] = clientDetails.__ss_padding[0x56];
      local_1f8.__ss_padding[0x57] = clientDetails.__ss_padding[0x57];
      local_1f8.__ss_padding[0x58] = clientDetails.__ss_padding[0x58];
      local_1f8.__ss_padding[0x59] = clientDetails.__ss_padding[0x59];
      local_1f8.__ss_padding[0x5a] = clientDetails.__ss_padding[0x5a];
      local_1f8.__ss_padding[0x5b] = clientDetails.__ss_padding[0x5b];
      local_1f8.__ss_padding[0x5c] = clientDetails.__ss_padding[0x5c];
      local_1f8.__ss_padding[0x5d] = clientDetails.__ss_padding[0x5d];
      clientDetails.__ss_padding._62_8_ = clientDetails_00.__ss_padding._62_8_;
      local_1f8.__ss_padding[0x3e] = clientDetails.__ss_padding[0x3e];
      local_1f8.__ss_padding[0x3f] = clientDetails.__ss_padding[0x3f];
      local_1f8.__ss_padding[0x40] = clientDetails.__ss_padding[0x40];
      local_1f8.__ss_padding[0x41] = clientDetails.__ss_padding[0x41];
      local_1f8.__ss_padding[0x42] = clientDetails.__ss_padding[0x42];
      local_1f8.__ss_padding[0x43] = clientDetails.__ss_padding[0x43];
      local_1f8.__ss_padding[0x44] = clientDetails.__ss_padding[0x44];
      local_1f8.__ss_padding[0x45] = clientDetails.__ss_padding[0x45];
      clientDetails.__ss_padding._70_8_ = clientDetails_00.__ss_padding._70_8_;
      local_1f8.__ss_padding[0x46] = clientDetails.__ss_padding[0x46];
      local_1f8.__ss_padding[0x47] = clientDetails.__ss_padding[0x47];
      local_1f8.__ss_padding[0x48] = clientDetails.__ss_padding[0x48];
      local_1f8.__ss_padding[0x49] = clientDetails.__ss_padding[0x49];
      local_1f8.__ss_padding[0x4a] = clientDetails.__ss_padding[0x4a];
      local_1f8.__ss_padding[0x4b] = clientDetails.__ss_padding[0x4b];
      local_1f8.__ss_padding[0x4c] = clientDetails.__ss_padding[0x4c];
      local_1f8.__ss_padding[0x4d] = clientDetails.__ss_padding[0x4d];
      clientDetails._0_8_ = clientDetails_00._0_8_;
      local_1f8.ss_family = clientDetails.ss_family;
      local_1f8.__ss_padding[0] = clientDetails.__ss_padding[0];
      local_1f8.__ss_padding[1] = clientDetails.__ss_padding[1];
      local_1f8.__ss_padding[2] = clientDetails.__ss_padding[2];
      local_1f8.__ss_padding[3] = clientDetails.__ss_padding[3];
      local_1f8.__ss_padding[4] = clientDetails.__ss_padding[4];
      local_1f8.__ss_padding[5] = clientDetails.__ss_padding[5];
      clientDetails.__ss_padding._6_8_ = clientDetails_00.__ss_padding._6_8_;
      local_1f8.__ss_padding[6] = clientDetails.__ss_padding[6];
      local_1f8.__ss_padding[7] = clientDetails.__ss_padding[7];
      local_1f8.__ss_padding[8] = clientDetails.__ss_padding[8];
      local_1f8.__ss_padding[9] = clientDetails.__ss_padding[9];
      local_1f8.__ss_padding[10] = clientDetails.__ss_padding[10];
      local_1f8.__ss_padding[0xb] = clientDetails.__ss_padding[0xb];
      local_1f8.__ss_padding[0xc] = clientDetails.__ss_padding[0xc];
      local_1f8.__ss_padding[0xd] = clientDetails.__ss_padding[0xd];
      clientDetails.__ss_padding._14_8_ = clientDetails_00.__ss_padding._14_8_;
      local_1f8.__ss_padding[0xe] = clientDetails.__ss_padding[0xe];
      local_1f8.__ss_padding[0xf] = clientDetails.__ss_padding[0xf];
      local_1f8.__ss_padding[0x10] = clientDetails.__ss_padding[0x10];
      local_1f8.__ss_padding[0x11] = clientDetails.__ss_padding[0x11];
      local_1f8.__ss_padding[0x12] = clientDetails.__ss_padding[0x12];
      local_1f8.__ss_padding[0x13] = clientDetails.__ss_padding[0x13];
      local_1f8.__ss_padding[0x14] = clientDetails.__ss_padding[0x14];
      local_1f8.__ss_padding[0x15] = clientDetails.__ss_padding[0x15];
      clientDetails.__ss_padding._22_8_ = clientDetails_00.__ss_padding._22_8_;
      local_1f8.__ss_padding[0x16] = clientDetails.__ss_padding[0x16];
      local_1f8.__ss_padding[0x17] = clientDetails.__ss_padding[0x17];
      local_1f8.__ss_padding[0x18] = clientDetails.__ss_padding[0x18];
      local_1f8.__ss_padding[0x19] = clientDetails.__ss_padding[0x19];
      local_1f8.__ss_padding[0x1a] = clientDetails.__ss_padding[0x1a];
      local_1f8.__ss_padding[0x1b] = clientDetails.__ss_padding[0x1b];
      local_1f8.__ss_padding[0x1c] = clientDetails.__ss_padding[0x1c];
      local_1f8.__ss_padding[0x1d] = clientDetails.__ss_padding[0x1d];
      clientDetails.__ss_padding._30_8_ = clientDetails_00.__ss_padding._30_8_;
      local_1f8.__ss_padding[0x1e] = clientDetails.__ss_padding[0x1e];
      local_1f8.__ss_padding[0x1f] = clientDetails.__ss_padding[0x1f];
      local_1f8.__ss_padding[0x20] = clientDetails.__ss_padding[0x20];
      local_1f8.__ss_padding[0x21] = clientDetails.__ss_padding[0x21];
      local_1f8.__ss_padding[0x22] = clientDetails.__ss_padding[0x22];
      local_1f8.__ss_padding[0x23] = clientDetails.__ss_padding[0x23];
      local_1f8.__ss_padding[0x24] = clientDetails.__ss_padding[0x24];
      local_1f8.__ss_padding[0x25] = clientDetails.__ss_padding[0x25];
      clientDetails.__ss_padding._38_8_ = clientDetails_00.__ss_padding._38_8_;
      local_1f8.__ss_padding[0x26] = clientDetails.__ss_padding[0x26];
      local_1f8.__ss_padding[0x27] = clientDetails.__ss_padding[0x27];
      local_1f8.__ss_padding[0x28] = clientDetails.__ss_padding[0x28];
      local_1f8.__ss_padding[0x29] = clientDetails.__ss_padding[0x29];
      local_1f8.__ss_padding[0x2a] = clientDetails.__ss_padding[0x2a];
      local_1f8.__ss_padding[0x2b] = clientDetails.__ss_padding[0x2b];
      local_1f8.__ss_padding[0x2c] = clientDetails.__ss_padding[0x2c];
      local_1f8.__ss_padding[0x2d] = clientDetails.__ss_padding[0x2d];
      clientDetails.__ss_padding._46_8_ = clientDetails_00.__ss_padding._46_8_;
      local_1f8.__ss_padding[0x2e] = clientDetails.__ss_padding[0x2e];
      local_1f8.__ss_padding[0x2f] = clientDetails.__ss_padding[0x2f];
      local_1f8.__ss_padding[0x30] = clientDetails.__ss_padding[0x30];
      local_1f8.__ss_padding[0x31] = clientDetails.__ss_padding[0x31];
      local_1f8.__ss_padding[0x32] = clientDetails.__ss_padding[0x32];
      local_1f8.__ss_padding[0x33] = clientDetails.__ss_padding[0x33];
      local_1f8.__ss_padding[0x34] = clientDetails.__ss_padding[0x34];
      local_1f8.__ss_padding[0x35] = clientDetails.__ss_padding[0x35];
      clientDetails.__ss_padding._54_8_ = clientDetails_00.__ss_padding._54_8_;
      local_1f8.__ss_padding[0x36] = clientDetails.__ss_padding[0x36];
      local_1f8.__ss_padding[0x37] = clientDetails.__ss_padding[0x37];
      local_1f8.__ss_padding[0x38] = clientDetails.__ss_padding[0x38];
      local_1f8.__ss_padding[0x39] = clientDetails.__ss_padding[0x39];
      local_1f8.__ss_padding[0x3a] = clientDetails.__ss_padding[0x3a];
      local_1f8.__ss_padding[0x3b] = clientDetails.__ss_padding[0x3b];
      local_1f8.__ss_padding[0x3c] = clientDetails.__ss_padding[0x3c];
      local_1f8.__ss_padding[0x3d] = clientDetails.__ss_padding[0x3d];
      sendResponse(this,socketFD,(byte *)sendUnit,clientDetails_00);
      this_02 = (Sliding *)operator_new(0x18);
      rudp = SendUnit::getRUDP(this_00,local_28);
      dVar1 = getTime(this);
      Sliding::Sliding(this_02,rudp,dVar1);
      pSStack_200 = this_02;
      std::deque<Sliding_*,_std::allocator<Sliding_*>_>::push_back
                ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum,
                 &stack0xfffffffffffffe00);
      local_28 = local_28 + 0x5b0;
      left = left + -1;
    }
    sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                      ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
    local_164 = (int)sVar6;
    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
      readFDs.fds_bits[(ulong)__arr_1._4_4_ - 1] = 0;
    }
    readFDs.fds_bits[(long)(socketFD / 0x40) + -1] =
         1L << ((byte)((long)socketFD % 0x40) & 0x3f) |
         readFDs.fds_bits[(long)(socketFD / 0x40) + -1];
    if ((timeValue.tv_sec != 0) &&
       (window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_node != (_Map_pointer)0x0)) {
      window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.super__Deque_impl_data
      ._M_finish._M_node = (_Map_pointer)((long)this_01->RTO / 1000000000);
      timeValue.tv_sec =
           (__time_t)
           (this_01->RTO * 1000.0 +
           -(double)(long)window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node);
    }
    do {
      while( true ) {
        SlideWindowDataNum =
             select(socketFD + 1,(fd_set *)local_e0,(fd_set *)0x0,(fd_set *)0x0,
                    (timeval *)
                    &window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
        if (SlideWindowDataNum == -1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Error in Select");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          piVar7 = __errno_location();
          pcVar8 = strerror(*piVar7);
          poVar5 = std::operator<<((ostream *)&std::cerr,pcVar8);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          exit(5);
        }
        if (SlideWindowDataNum < 1) break;
        timeValue.tv_usec._0_4_ = readAck(this,socketFD,clientDetails_00);
        poVar5 = std::operator<<((ostream *)&std::cout,"Ack Event ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        if (buffer._4_4_ < (byte4)timeValue.tv_usec) {
          poVar5 = std::operator<<((ostream *)&std::cout,"New ACK: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(byte4)timeValue.tv_usec);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                            ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
          if ((sVar6 != 0) &&
             (ppSVar9 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::front
                                  ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum),
             (*ppSVar9)->seqNo <= (byte4)timeValue.tv_usec - 0x5b0)) {
            while ((bVar10 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::empty
                                       ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum
                                       ), ((bVar10 ^ 0xffU) & 1) != 0 &&
                   ((ppSVar9 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::front
                                         ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)
                                          &sendDataNum),
                    (*ppSVar9)->seqNo < (byte4)timeValue.tv_usec &&
                    (ppSVar9 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::front
                                         ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)
                                          &sendDataNum), ((*ppSVar9)->mark & 1U) == 0))))) {
              ppSVar9 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::front
                                  ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
              dVar1 = (*ppSVar9)->sentTime;
              end = getTime(this);
              Congestion::updateRTT(this_01,dVar1,end);
              std::deque<Sliding_*,_std::allocator<Sliding_*>_>::pop_front
                        ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
            }
          }
          sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                            ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
          buffer._4_4_ = (byte4)timeValue.tv_usec;
          if (sVar6 == 0) {
            local_168 = 0;
            if ((this_01->ssthresh <= this_01->cwnd) &&
               ((this_01->ssthresh != -1.0 || (NAN(this_01->ssthresh))))) {
              this_01->isSlowStart = false;
              poVar5 = std::operator<<((ostream *)&std::cout,"Entering Congestion Avoidance mode");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            if ((this_01->isSlowStart & 1U) == 0) {
              Congestion::updateCongestionAvoidance(this_01);
            }
            else {
              Congestion::updateSlowStart(this_01);
            }
            goto LAB_001047bd;
          }
        }
        else {
          this_01->dupAck = this_01->dupAck + 1;
          poVar5 = std::operator<<((ostream *)&std::cout,"Dup ACK: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(byte4)timeValue.tv_usec);
          poVar5 = std::operator<<(poVar5," ACK Count:");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,this_01->dupAck);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          if (2 < this_01->dupAck) {
            retransmit(this,(byte4)timeValue.tv_usec,socketFD,clientDetails_00,this_00);
            Congestion::updateRTO(this_01);
            readFDs.fds_bits[0xf]._4_4_ = readFDs.fds_bits[0xf]._4_4_ + 1;
            poVar5 = std::operator<<((ostream *)&std::cout,"Retransmitting : ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(byte4)timeValue.tv_usec);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                              ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
            if ((sVar6 != 0) &&
               (ppSVar9 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::front
                                    ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum),
               ((*ppSVar9)->mark & 1U) == 0)) {
              for (local_31c = 0;
                  sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                                    ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum),
                  (ulong)(long)local_31c < sVar6 - 1; local_31c = local_31c + 1) {
                ppSVar9 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::operator[]
                                    ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum,
                                     (long)local_31c);
                (*ppSVar9)->mark = true;
              }
            }
            Congestion::slowStart(this_01);
            this_01->dupAck = 0;
            sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                              ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
            local_168 = (int)sVar6;
          }
        }
      }
    } while (SlideWindowDataNum != 0);
    poVar5 = std::operator<<((ostream *)&std::cout,"Timeout Event ");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if ((window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0) && (timeValue.tv_sec == 0))
    {
      sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                        ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
      readFDs.fds_bits[0xf]._4_4_ = readFDs.fds_bits[0xf]._4_4_ + (int)sVar6;
      sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                        ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
      if (sVar6 != 0) {
        sVar6 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                          ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
        local_168 = (int)sVar6;
        retransmit(this,(byte4)timeValue.tv_usec,socketFD,clientDetails_00,this_00);
        poVar5 = std::operator<<((ostream *)&std::cout,"Retransmitting : ");
        ppSVar9 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::front
                            ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*ppSVar9)->seqNo);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::deque<Sliding_*,_std::allocator<Sliding_*>_>::clear
                  ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
      }
      Congestion::slowStart(this_01);
    }
LAB_001047bd:
    poVar5 = std::operator<<((ostream *)&std::cout,"Percentage of Packets Sent: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_164 - local_168);
    poVar5 = std::operator<<(poVar5,"/");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_164);
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,((float)(local_164 - local_168) / (float)local_164) * 100.0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_164 = 0;
    local_168 = 0;
    if ((this_00->dataSize < (ulong)(local_28 - seqNo_00)) ||
       (this_00->dataSize < (ulong)((byte4)timeValue.tv_usec - seqNo_00))) {
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"Last Packet has been delivered & All ACKs have been received"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      memset(sendUnit,0,0x5c0);
      if (this_00 != (SendUnit *)0x0) {
        operator_delete(this_00,0x20);
      }
      std::deque<Sliding_*,_std::allocator<Sliding_*>_>::~deque
                ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)&sendDataNum);
      return true;
    }
  } while( true );
}

Assistant:

bool
ServerService::sendSegments(byte *data, int socketFD, struct sockaddr_storage clientDetails, int recvWindowSize) {

    byte4 initSeqNo = rand() % 100;
    byte4 seqNo = initSeqNo;
    byte4 sendBase = initSeqNo;

    byte *buffer = (byte *) calloc(MTU, sizeof(byte));
    memset(buffer, 0, MTU);

    //使用序号获取 udp
    auto *sendUnit = new SendUnit(initSeqNo, data);

    auto *congestion = new Congestion(recvWindowSize);

    // 丢包数
    int packetDropped = 0;
    //数据分段数量
    int packetNumber = (int) (sendUnit->dataSize / (MTU - HEADER_LEN)) + 1;

    fd_set readFDs; // fd_set 来存储文件描述符, 用于使用多个套接字时不阻塞线程
    FD_ZERO(&readFDs); //FD_ZERO宏将一个 fd_set 类型变量的所有位都设为 0
    FD_SET(socketFD, &readFDs);
    int nextFD = socketFD + 1;

    byte4 ackNo;

    struct timeval timeValue;
    timeValue.tv_sec = 0; //秒
    timeValue.tv_usec = INIT_SEC; //微秒

    //双端队列实现滑动窗口
    deque<Sliding *> window;
    window.clear();
    int readyDescriptors; // -1 -> Error
    int sendDataNum; // 单次需要发送数据段数量
    int SlideWindowDataNum = 0;
    int left = 0;

    while (true) {
        sendDataNum = (int) min(congestion->cwnd, (double) recvWindowSize);
        if (congestion->isSlowStart) {
            cout << "Sending Packets in mode: Slow Start" << endl;
            cout << "Maximum Packets that will be sent:" << sendDataNum << endl;
        } else {
            cout << "Sending Packets in mode: Congestion Avoidance" << endl;
            cout << "Maximum Packets that will be sent:" << sendDataNum << endl;
        }

        cout << "RetransmissionTime-Out: " << congestion->RTO << endl;
        window.clear();

        //向滑动窗格填充数据
        while (sendDataNum != 0 && (seqNo - initSeqNo) < sendUnit->dataSize) {
            buffer = sendUnit->getSendUnit(seqNo);
            sendResponse(socketFD, buffer, clientDetails);
            window.push_back(new Sliding(sendUnit->getRUDP(seqNo), getTime()));
            seqNo += (MTU - HEADER_LEN);
            sendDataNum--;
        }
        //获取滑动窗格分组数
        SlideWindowDataNum = (int) window.size();

        FD_ZERO(&readFDs);
        FD_SET(socketFD, &readFDs);
        if (timeValue.tv_usec != 0 && timeValue.tv_sec != 0) {
            timeValue.tv_sec = (long) congestion->RTO / NANO_SEC;
            timeValue.tv_usec = (congestion->RTO) * 1000 - timeValue.tv_sec;
        }

        while (true) {
            readyDescriptors = select(nextFD, &readFDs, NULL, NULL, &timeValue);
            if (readyDescriptors == -1) {
                cout << "Error in Select" << endl;
                cerr << strerror(errno) << endl;
                exit(5);
            } else if (readyDescriptors > 0) {
                // ACK 判断
                ackNo = readAck(socketFD, clientDetails);
                cout << "Ack Event " << endl;
                if (sendBase < ackNo) {
                    // 创建新 ACK
                    cout << "New ACK: " << ackNo << endl;
                    sendBase = ackNo;
                    if (window.size() > 0 && sendBase - (MTU - HEADER_LEN) >= window.front()->seqNo) {
                        while (!window.empty()) {
                            if (window.front()->seqNo < sendBase && window.front()->mark == false) {
                                congestion->updateRTT(window.front()->sentTime, getTime());
                                window.pop_front();
                            } else {
                                break;
                            }
                        }
                    }
                    if (window.size() == 0) {
                        left = 0;
                        if (congestion->cwnd >= congestion->ssthresh && congestion->ssthresh != -1) {
                            congestion->isSlowStart = false; // congestion avoidance
                            cout << "Entering Congestion Avoidance mode" << endl;
                        }
                        if (congestion->isSlowStart) {
                            congestion->updateSlowStart();
                        } else {
                            congestion->updateCongestionAvoidance();
                        }
                        break;
                    }
                } else {
                    // 重复的 ACK 确认
                    congestion->dupAck++;
                    cout << "Dup ACK: " << ackNo << " ACK Count:" << congestion->dupAck << endl;
                    if (congestion->dupAck >= 3) {
                        // 三次收到重复 ACK 后立即重传
                        retransmit(ackNo, socketFD, clientDetails, sendUnit);
                        congestion->updateRTO();
                        packetDropped++;
                        cout << "Retransmitting : " << ackNo << endl;
                        if (window.size() != 0) {
                            if (!window.front()->mark) {
                                for (int i = 0; i < window.size() - 1; i++) {
                                    window[i]->mark = true;
                                }
                            }
                        }
                        congestion->slowStart();
                        congestion->dupAck = 0;
                        left = window.size();
                    }
                }
            } else if (readyDescriptors == 0) {
                // 超时
                cout << "Timeout Event " << endl;
                if (timeValue.tv_sec == 0 && timeValue.tv_usec == 0) {
                    // Loss occurred go back to slow start
                    packetDropped += window.size();
                    if (window.size() != 0) {
                        left = window.size();
                        retransmit(ackNo, socketFD, clientDetails, sendUnit);
                        cout << "Retransmitting : " << window.front()->seqNo << endl;
                        window.clear();
                    }
                    congestion->slowStart();
                }
                break;
            }
        }

        cout << "Percentage of Packets Sent: " << SlideWindowDataNum - left << "/" << SlideWindowDataNum << " = "
             << ((float) (SlideWindowDataNum - left) / SlideWindowDataNum) * 100 << endl;
        SlideWindowDataNum = 0, left = 0;
        if ((seqNo - initSeqNo) > sendUnit->dataSize || (ackNo - initSeqNo) > sendUnit->dataSize) {
            cout << endl << "Last Packet has been delivered & All ACKs have been received" << endl;
            break;
        }
    }

    memset(buffer, 0, MTU);
    delete sendUnit;
    return true;
}